

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xpath_node_set * __thiscall
pugi::xpath_query::evaluate_node_set
          (xpath_node_set *__return_storage_ptr__,xpath_query *this,xpath_node *n)

{
  xpath_ast_node *this_00;
  undefined8 *puVar1;
  xpath_node_set_raw r;
  xpath_context c;
  xpath_stack_data sd;
  
  this_00 = impl::anon_unknown_0::evaluate_node_set_prepare((xpath_query_impl *)this->_impl);
  if (this_00 == (xpath_ast_node *)0x0) {
    __return_storage_ptr__->_type = type_unsorted;
    __return_storage_ptr__->_storage[0]._node._root = (xml_node_struct *)0x0;
    __return_storage_ptr__->_storage[0]._attribute._attr = (xml_attribute_struct *)0x0;
    __return_storage_ptr__->_begin = __return_storage_ptr__->_storage;
    __return_storage_ptr__->_end = __return_storage_ptr__->_storage;
  }
  else {
    c.n._node._root = (n->_node)._root;
    c.n._attribute._attr = (n->_attribute)._attr;
    sd.result._error = &sd.oom;
    sd.result._root = sd.blocks;
    sd.result._root_size = 0;
    sd.stack.temp = &sd.temp;
    sd.temp._root = sd.blocks + 1;
    sd.temp._root_size = 0;
    sd.oom = false;
    sd.blocks[1].next = (xpath_memory_block *)0x0;
    c.position = 1;
    sd.blocks[0].next = (xpath_memory_block *)0x0;
    c.size = 1;
    sd.stack.result = &sd.result;
    sd.blocks[1].capacity = 0x1000;
    sd.blocks[0].capacity = 0x1000;
    sd.temp._error = sd.result._error;
    impl::anon_unknown_0::xpath_ast_node::eval_node_set(&r,this_00,&c,&sd.stack,nodeset_eval_all);
    if (sd.oom == true) {
      puVar1 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar1 = std::__throw_system_error;
      __cxa_throw(puVar1,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    xpath_node_set::xpath_node_set(__return_storage_ptr__,r._begin,r._end,r._type);
    impl::anon_unknown_0::xpath_stack_data::~xpath_stack_data(&sd);
  }
  return __return_storage_ptr__;
}

Assistant:

PUGI_IMPL_FN xpath_node_set xpath_query::evaluate_node_set(const xpath_node& n) const
	{
		impl::xpath_ast_node* root = impl::evaluate_node_set_prepare(static_cast<impl::xpath_query_impl*>(_impl));
		if (!root) return xpath_node_set();

		impl::xpath_context c(n, 1, 1);
		impl::xpath_stack_data sd;

		impl::xpath_node_set_raw r = root->eval_node_set(c, sd.stack, impl::nodeset_eval_all);

		if (sd.oom)
		{
		#ifdef PUGIXML_NO_EXCEPTIONS
			return xpath_node_set();
		#else
			throw std::bad_alloc();
		#endif
		}

		return xpath_node_set(r.begin(), r.end(), r.type());
	}